

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_0000_0999.cpp
# Opt level: O3

void __thiscall psy::C::ParserTester::case0447(ParserTester *this)

{
  string text;
  Expectation X;
  ParseOptions parseOpts;
  Expectation *pEVar1;
  initializer_list<psy::C::SyntaxKind> __l;
  undefined8 in_stack_fffffffffffffe08;
  pointer in_stack_fffffffffffffe10;
  pointer in_stack_fffffffffffffe18;
  pointer in_stack_fffffffffffffe20;
  undefined1 *puVar2;
  undefined8 in_stack_fffffffffffffe30;
  long in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe48;
  anon_union_8_2_2d0bec1f_for_MacroTranslations_0 in_stack_fffffffffffffe50;
  anon_union_8_2_2d0bec1f_for_LanguageExtensions_1 in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe68 [64];
  _Alloc_hider in_stack_fffffffffffffea8;
  size_type in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffec0 [16];
  pointer in_stack_fffffffffffffed0;
  pointer in_stack_fffffffffffffed8;
  pointer local_120;
  vector<psy::C::Decl,_std::allocator<psy::C::Decl>_> local_118;
  pointer local_f8;
  pointer local_e8;
  Expectation local_e0;
  SyntaxKind local_28 [12];
  
  puVar2 = &stack0xfffffffffffffe38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffe28,"struct x { struct { int z ; } ; } ;","");
  Expectation::Expectation((Expectation *)&stack0xfffffffffffffe68);
  local_28[0] = STARTof_Node;
  local_28[1] = StructDeclaration;
  local_28[2] = StructTypeSpecifier;
  local_28[3] = FieldDeclaration;
  local_28[4] = TagDeclarationAsSpecifier;
  local_28[5] = StructTypeSpecifier;
  local_28[6] = FieldDeclaration;
  local_28[7] = BasicTypeSpecifier;
  local_28[8] = 0x412;
  __l._M_len = 9;
  __l._M_array = local_28;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            ((vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)
             &stack0xfffffffffffffe10,__l,(allocator_type *)&stack0xfffffffffffffe0f);
  pEVar1 = Expectation::AST((Expectation *)&stack0xfffffffffffffe68,
                            (vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)
                            &stack0xfffffffffffffe10);
  Expectation::Expectation(&local_e0,pEVar1);
  ParseOptions::ParseOptions((ParseOptions *)&stack0xfffffffffffffe48);
  text._M_string_length = in_stack_fffffffffffffe50.BF_all_;
  text._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe48;
  text.field_2._M_allocated_capacity = in_stack_fffffffffffffe58.BF_all_;
  text.field_2._8_8_ = in_stack_fffffffffffffe60;
  X.descriptorsE_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffe10;
  X.numE_ = (int)in_stack_fffffffffffffe08;
  X.numW_ = (int)((ulong)in_stack_fffffffffffffe08 >> 0x20);
  X.descriptorsE_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffe18;
  X.descriptorsE_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffe20;
  X.descriptorsW_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar2;
  X.descriptorsW_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffe30;
  X.descriptorsW_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffe38;
  X.continueTestDespiteOfErrors_ = (bool)(char)in_stack_fffffffffffffe40;
  X.containsAmbiguity_ = (bool)(char)((ulong)in_stack_fffffffffffffe40 >> 8);
  X._58_6_ = (int6)((ulong)in_stack_fffffffffffffe40 >> 0x10);
  X.ambiguityText_._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe48;
  X.ambiguityText_._M_string_length = in_stack_fffffffffffffe50.BF_all_;
  X.ambiguityText_.field_2._M_allocated_capacity = in_stack_fffffffffffffe58.BF_all_;
  X.ambiguityText_.field_2._8_8_ = in_stack_fffffffffffffe60;
  X.unfinishedParse_ = (bool)in_stack_fffffffffffffe68[0];
  X._97_7_ = in_stack_fffffffffffffe68._1_7_;
  X.syntaxKinds_.super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl
  .super__Vector_impl_data =
       (_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>)
       (_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>)
       in_stack_fffffffffffffe68._8_24_;
  X.declarations_.super__Vector_base<psy::C::Decl,_std::allocator<psy::C::Decl>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<psy::C::Decl,_std::allocator<psy::C::Decl>_>)
       (_Vector_base<psy::C::Decl,_std::allocator<psy::C::Decl>_>)in_stack_fffffffffffffe68._32_24_;
  X.checkScope_ = (bool)in_stack_fffffffffffffe68[0x38];
  X._153_7_ = in_stack_fffffffffffffe68._57_7_;
  X.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_fffffffffffffea8._M_p;
  X.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_fffffffffffffeb0;
  X.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_stack_fffffffffffffeb8;
  parseOpts.langExts_.field_1 =
       (anon_union_8_2_2d0bec1f_for_LanguageExtensions_1)in_stack_fffffffffffffed0;
  parseOpts.langDialect_.std_ = in_stack_fffffffffffffec0[0];
  parseOpts._1_7_ = in_stack_fffffffffffffec0._1_7_;
  parseOpts.langExts_.translations_.field_0 =
       (anon_union_8_2_2d0bec1f_for_MacroTranslations_0)in_stack_fffffffffffffec0._8_8_;
  parseOpts._24_8_ = in_stack_fffffffffffffed8;
  parse(this,text,X,(SyntaxCategory)&stack0xfffffffffffffe28,parseOpts);
  if (local_e0.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<psy::C::Decl,_std::allocator<psy::C::Decl>_>::~vector(&local_e0.declarations_);
  if (local_e0.syntaxKinds_.
      super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.syntaxKinds_.
                    super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e0.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.ambiguityText_._M_dataplus._M_p != &local_e0.ambiguityText_.field_2) {
    operator_delete(local_e0.ambiguityText_._M_dataplus._M_p,
                    local_e0.ambiguityText_.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e0.descriptorsW_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e0.descriptorsE_);
  if (in_stack_fffffffffffffe10 != (pointer)0x0) {
    operator_delete(in_stack_fffffffffffffe10,
                    (long)in_stack_fffffffffffffe20 - (long)in_stack_fffffffffffffe10);
  }
  if (local_f8 != (pointer)0x0) {
    operator_delete(local_f8,(long)local_e8 - (long)local_f8);
  }
  std::vector<psy::C::Decl,_std::allocator<psy::C::Decl>_>::~vector(&local_118);
  if (in_stack_fffffffffffffed0 != (pointer)0x0) {
    operator_delete(in_stack_fffffffffffffed0,(long)local_120 - (long)in_stack_fffffffffffffed0);
  }
  if (in_stack_fffffffffffffea8._M_p != &stack0xfffffffffffffeb8) {
    operator_delete(in_stack_fffffffffffffea8._M_p,in_stack_fffffffffffffeb8 + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xfffffffffffffe88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xfffffffffffffe70);
  if (puVar2 != &stack0xfffffffffffffe38) {
    operator_delete(puVar2,in_stack_fffffffffffffe38 + 1);
  }
  return;
}

Assistant:

void ParserTester::case0447()
{
    parse("struct x { struct { int z ; } ; } ;",
          Expectation().AST({ SyntaxKind::TranslationUnit,
                              SyntaxKind::StructDeclaration,
                              SyntaxKind::StructTypeSpecifier,
                              SyntaxKind::FieldDeclaration,
                              SyntaxKind::TagDeclarationAsSpecifier,
                              SyntaxKind::StructTypeSpecifier,
                              SyntaxKind::FieldDeclaration,
                              SyntaxKind::BasicTypeSpecifier,
                              SyntaxKind::IdentifierDeclarator }));
}